

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_callback_ret.cpp
# Opt level: O0

void __thiscall cubeb_test_output_callback_Test::TestBody(cubeb_test_output_callback_Test *this)

{
  string *in_stack_00000110;
  cubeb_data_callback in_stack_00000118;
  test_direction in_stack_00000124;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [39];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"output only, return 0",&local_29);
  run_test_callback(in_stack_00000124,in_stack_00000118,in_stack_00000110);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"output only, return nframes - 1",&local_51);
  run_test_callback(in_stack_00000124,in_stack_00000118,in_stack_00000110);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"output only, return nframes",&local_79);
  run_test_callback(in_stack_00000124,in_stack_00000118,in_stack_00000110);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return;
}

Assistant:

TEST(cubeb, test_output_callback)
{
  run_test_callback(OUTPUT_ONLY, data_cb_ret_zero, "output only, return 0");
  run_test_callback(OUTPUT_ONLY, data_cb_ret_nframes_minus_one, "output only, return nframes - 1");
  run_test_callback(OUTPUT_ONLY, data_cb_ret_nframes, "output only, return nframes");
}